

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_cmpm_8_axy7(void)

{
  uint uVar1;
  uint uVar2;
  uint res;
  uint dst;
  uint src;
  
  uVar1 = OPER_A7_PI_8();
  uVar2 = OPER_A7_PI_8();
  m68ki_cpu.n_flag = uVar2 - uVar1;
  m68ki_cpu.not_z_flag = m68ki_cpu.n_flag & 0xff;
  m68ki_cpu.v_flag = (uVar1 ^ uVar2) & (m68ki_cpu.n_flag ^ uVar2);
  m68ki_cpu.c_flag = m68ki_cpu.n_flag;
  return;
}

Assistant:

static void m68k_op_cmpm_8_axy7(void)
{
	uint src = OPER_A7_PI_8();
	uint dst = OPER_A7_PI_8();
	uint res = dst - src;

	FLAG_N = NFLAG_8(res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);
	FLAG_V = VFLAG_SUB_8(src, dst, res);
	FLAG_C = CFLAG_8(res);
}